

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

int MMDB_open(char *filename,uint32_t flags,MMDB_s *mmdb)

{
  int iVar1;
  _Bool _Var2;
  char *pcVar3;
  uint8_t *puVar4;
  long lVar5;
  int *piVar6;
  int saved_errno;
  ssize_t data_section_size;
  ssize_t search_tree_size;
  uint8_t *metadata;
  uint32_t metadata_size;
  int status;
  MMDB_s *mmdb_local;
  char *pcStack_10;
  uint32_t flags_local;
  char *filename_local;
  
  metadata._4_4_ = 0;
  mmdb->file_content = (uint8_t *)0x0;
  mmdb->data_section = (uint8_t *)0x0;
  (mmdb->metadata).database_type = (char *)0x0;
  (mmdb->metadata).languages.count = 0;
  (mmdb->metadata).languages.names = (char **)0x0;
  (mmdb->metadata).description.count = 0;
  _metadata_size = mmdb;
  mmdb_local._4_4_ = flags;
  pcStack_10 = filename;
  pcVar3 = mmdb_strdup(filename);
  _metadata_size->filename = pcVar3;
  if (_metadata_size->filename == (char *)0x0) {
    metadata._4_4_ = 5;
  }
  else {
    if ((mmdb_local._4_4_ & 7) == 0) {
      mmdb_local._4_4_ = mmdb_local._4_4_ | 1;
    }
    _metadata_size->flags = mmdb_local._4_4_;
    metadata._4_4_ = map_file(_metadata_size);
    if (metadata._4_4_ == 0) {
      metadata._0_4_ = 0;
      puVar4 = find_metadata(_metadata_size->file_content,_metadata_size->file_size,
                             (uint32_t *)&metadata);
      if (puVar4 == (uint8_t *)0x0) {
        metadata._4_4_ = 3;
      }
      else {
        _metadata_size->metadata_section = puVar4;
        _metadata_size->metadata_section_size = (uint32_t)metadata;
        metadata._4_4_ = read_metadata(_metadata_size);
        if (metadata._4_4_ == 0) {
          if ((_metadata_size->metadata).binary_format_major_version == 2) {
            _Var2 = can_multiply(0x7fffffffffffffff,(ulong)(_metadata_size->metadata).node_count,
                                 (ulong)_metadata_size->full_record_byte_size);
            if (_Var2) {
              lVar5 = (ulong)(_metadata_size->metadata).node_count *
                      (ulong)_metadata_size->full_record_byte_size;
              _metadata_size->data_section = _metadata_size->file_content + lVar5 + 0x10;
              if ((_metadata_size->file_size < 0x10) || (_metadata_size->file_size + -0x10 < lVar5))
              {
                metadata._4_4_ = 3;
              }
              else {
                lVar5 = (_metadata_size->file_size - lVar5) + -0x10;
                if ((lVar5 < 0x100000000) && (0 < lVar5)) {
                  _metadata_size->data_section_size = (uint32_t)lVar5;
                  if (_metadata_size->data_section_size < 3) {
                    metadata._4_4_ = 7;
                  }
                  else {
                    _metadata_size->metadata_section = puVar4;
                    (_metadata_size->ipv4_start_node).node_value = 0;
                    (_metadata_size->ipv4_start_node).netmask = 0;
                    if ((_metadata_size->metadata).ip_version == 6) {
                      metadata._4_4_ = find_ipv4_start_node(_metadata_size);
                    }
                  }
                }
                else {
                  metadata._4_4_ = 3;
                }
              }
            }
            else {
              metadata._4_4_ = 3;
            }
          }
          else {
            metadata._4_4_ = 6;
          }
        }
      }
    }
  }
  if (metadata._4_4_ != 0) {
    piVar6 = __errno_location();
    iVar1 = *piVar6;
    free_mmdb_struct(_metadata_size);
    piVar6 = __errno_location();
    *piVar6 = iVar1;
  }
  return metadata._4_4_;
}

Assistant:

int MMDB_open(const char *const filename, uint32_t flags, MMDB_s *const mmdb) {
    int status = MMDB_SUCCESS;

    mmdb->file_content = NULL;
    mmdb->data_section = NULL;
    mmdb->metadata.database_type = NULL;
    mmdb->metadata.languages.count = 0;
    mmdb->metadata.languages.names = NULL;
    mmdb->metadata.description.count = 0;

    mmdb->filename = mmdb_strdup(filename);
    if (NULL == mmdb->filename) {
        status = MMDB_OUT_OF_MEMORY_ERROR;
        goto cleanup;
    }

    if ((flags & MMDB_MODE_MASK) == 0) {
        flags |= MMDB_MODE_MMAP;
    }
    mmdb->flags = flags;

    if (MMDB_SUCCESS != (status = map_file(mmdb))) {
        goto cleanup;
    }

#ifdef _WIN32
    WSADATA wsa;
    WSAStartup(MAKEWORD(2, 2), &wsa);
#endif

    uint32_t metadata_size = 0;
    const uint8_t *metadata =
        find_metadata(mmdb->file_content, mmdb->file_size, &metadata_size);
    if (NULL == metadata) {
        status = MMDB_INVALID_METADATA_ERROR;
        goto cleanup;
    }

    mmdb->metadata_section = metadata;
    mmdb->metadata_section_size = metadata_size;

    status = read_metadata(mmdb);
    if (MMDB_SUCCESS != status) {
        goto cleanup;
    }

    if (mmdb->metadata.binary_format_major_version != 2) {
        status = MMDB_UNKNOWN_DATABASE_FORMAT_ERROR;
        goto cleanup;
    }

    if (!can_multiply(SSIZE_MAX,
                      mmdb->metadata.node_count,
                      mmdb->full_record_byte_size)) {
        status = MMDB_INVALID_METADATA_ERROR;
        goto cleanup;
    }
    ssize_t search_tree_size = (ssize_t)mmdb->metadata.node_count *
                               (ssize_t)mmdb->full_record_byte_size;

    mmdb->data_section =
        mmdb->file_content + search_tree_size + MMDB_DATA_SECTION_SEPARATOR;
    if (mmdb->file_size < MMDB_DATA_SECTION_SEPARATOR ||
        search_tree_size > mmdb->file_size - MMDB_DATA_SECTION_SEPARATOR) {
        status = MMDB_INVALID_METADATA_ERROR;
        goto cleanup;
    }
    ssize_t data_section_size =
        mmdb->file_size - search_tree_size - MMDB_DATA_SECTION_SEPARATOR;
    if (data_section_size > UINT32_MAX || data_section_size <= 0) {
        status = MMDB_INVALID_METADATA_ERROR;
        goto cleanup;
    }
    mmdb->data_section_size = (uint32_t)data_section_size;

    // Although it is likely not possible to construct a database with valid
    // valid metadata, as parsed above, and a data_section_size less than 3,
    // we do this check as later we assume it is at least three when doing
    // bound checks.
    if (mmdb->data_section_size < 3) {
        status = MMDB_INVALID_DATA_ERROR;
        goto cleanup;
    }

    mmdb->metadata_section = metadata;
    mmdb->ipv4_start_node.node_value = 0;
    mmdb->ipv4_start_node.netmask = 0;

    // We do this immediately as otherwise there is a race to set
    // ipv4_start_node.node_value and ipv4_start_node.netmask.
    if (mmdb->metadata.ip_version == 6) {
        status = find_ipv4_start_node(mmdb);
        if (status != MMDB_SUCCESS) {
            goto cleanup;
        }
    }

cleanup:
    if (MMDB_SUCCESS != status) {
        int saved_errno = errno;
        free_mmdb_struct(mmdb);
        errno = saved_errno;
    }
    return status;
}